

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void free_dfg_state(EVdfg_configuration state)

{
  int *piVar1;
  char *__ptr;
  EVdfg_stone_state p_Var2;
  long lVar3;
  long lVar4;
  
  if (0 < state->stone_count) {
    lVar3 = 0;
    do {
      piVar1 = state->stones[lVar3]->out_links;
      if (piVar1 != (int *)0x0) {
        free(piVar1);
      }
      piVar1 = state->stones[lVar3]->in_links;
      if (piVar1 != (int *)0x0) {
        free(piVar1);
      }
      __ptr = state->stones[lVar3]->action;
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
      if (state->stones[lVar3]->extra_actions != (char **)0x0) {
        p_Var2 = state->stones[lVar3];
        if (1 < p_Var2->action_count) {
          lVar4 = 0;
          do {
            free(p_Var2->extra_actions[lVar4]);
            lVar4 = lVar4 + 1;
            p_Var2 = state->stones[lVar3];
          } while (lVar4 < (long)p_Var2->action_count + -1);
        }
        free(p_Var2->extra_actions);
      }
      if (state->stones[lVar3]->attrs != (attr_list)0x0) {
        free_attr_list();
      }
      free(state->stones[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < state->stone_count);
  }
  if (state->pending_action_queue != (_EVdfg_config_action *)0x0) {
    free(state->pending_action_queue);
  }
  free(state->stones);
  free(state);
  return;
}

Assistant:

static void
free_dfg_state(EVdfg_configuration state)
{
    int i;
    for (i=0; i < state->stone_count; i++) {
    	if (state->stones[i]->out_links) free(state->stones[i]->out_links);
    	if (state->stones[i]->in_links) free(state->stones[i]->in_links);
    	if (state->stones[i]->action) free(state->stones[i]->action);
    	if (state->stones[i]->extra_actions) {
    	    int j;
    	    for (j=0; j < state->stones[i]->action_count-1; j++) {
    		free(state->stones[i]->extra_actions[j]);
    	    }
    	    free(state->stones[i]->extra_actions);
    	}
    	if (state->stones[i]->attrs) free_attr_list(state->stones[i]->attrs);
    	free(state->stones[i]);
    }
    if (state->pending_action_queue) free(state->pending_action_queue);
    free(state->stones);
    free(state);
}